

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cpp
# Opt level: O0

long cinemo::threading::getCpuCoreCount(void)

{
  long numCores;
  
  numCores = sysconf(0x54);
  if (numCores < 1) {
    numCores = 4;
  }
  return numCores;
}

Assistant:

long getCpuCoreCount() {
            long numCores = 0;
#ifdef WIN32
            SYSTEM_INFO sysinfo;
            GetSystemInfo(&sysinfo);
            numCores = sysinfo.dwNumberOfProcessors;
#else
            numCores = sysconf(_SC_NPROCESSORS_ONLN);
#endif
            if (numCores > 0) { //check if num of cores could be detected
                return numCores;
            }

            return 4; //rule of thumb! assume quad core processor
        }